

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
argstest::
ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argstest::ValueReader>
::~ValueFlag(ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argstest::ValueReader>
             *this)

{
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_argstest::ValueReader>
  *this_local;
  
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlag_00369e90;
  std::__cxx11::string::~string((string *)&this->defaultValue);
  std::__cxx11::string::~string((string *)&this->value);
  ValueFlagBase::~ValueFlagBase(&this->super_ValueFlagBase);
  return;
}

Assistant:

virtual ~ValueFlag() {}